

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathRect
          (ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,ImDrawCornerFlags rounding_corners)

{
  ImVec2 IVar1;
  uint uVar2;
  ImVector<ImVec2> *this_00;
  float fVar3;
  undefined1 in_register_00001204 [60];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  ImVec2 local_58;
  float local_50;
  float local_4c;
  undefined1 local_48 [16];
  
  auVar4._4_60_ = in_register_00001204;
  auVar4._0_4_ = rounding;
  uVar2 = ~rounding_corners;
  fVar8 = 0.5;
  fVar3 = fVar8;
  if ((uVar2 & 0xc) != 0) {
    fVar3 = 1.0;
  }
  fVar10 = fVar8;
  if ((uVar2 & 3) != 0) {
    fVar10 = fVar3;
  }
  if ((uVar2 & 10) != 0) {
    fVar8 = 1.0;
  }
  fVar3 = 0.5;
  if ((uVar2 & 5) != 0) {
    fVar3 = fVar8;
  }
  if (rounding_corners != 0) {
    IVar1 = *a;
    auVar5._8_8_ = 0;
    auVar5._0_4_ = IVar1.x;
    auVar5._4_4_ = IVar1.y;
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    auVar6 = vandps_avx(ZEXT416((uint)(b->x - IVar1.x)),auVar11);
    auVar7 = vmovshdup_avx(auVar5);
    auVar5 = vminss_avx(auVar4._0_16_,ZEXT416((uint)(auVar6._0_4_ * fVar10 + -1.0)));
    auVar6 = vandps_avx(ZEXT416((uint)(b->y - auVar7._0_4_)),auVar11);
    auVar6 = vminss_avx(auVar5,ZEXT416((uint)(auVar6._0_4_ * fVar3 + -1.0)));
    if (0.0 < auVar6._0_4_) {
      auVar5 = ZEXT816(0) << 0x20;
      if ((rounding_corners & 1U) != 0) {
        auVar5 = auVar6;
      }
      auVar7 = ZEXT816(0);
      if ((rounding_corners & 2U) != 0) {
        auVar7 = auVar6;
      }
      local_4c = auVar7._0_4_;
      local_48 = ZEXT816(0) << 0x20;
      if ((rounding_corners & 8U) != 0) {
        local_48 = auVar6;
      }
      auVar7 = ZEXT816(0) << 0x20;
      if ((rounding_corners & 4U) != 0) {
        auVar7 = auVar6;
      }
      local_50 = auVar7._0_4_;
      fVar3 = auVar5._0_4_;
      auVar6._0_4_ = IVar1.x + fVar3;
      auVar6._4_4_ = IVar1.y + fVar3;
      auVar6._8_4_ = fVar3 + 0.0;
      auVar6._12_4_ = fVar3 + 0.0;
      local_58 = (ImVec2)vmovlps_avx(auVar6);
      PathArcToFast(this,&local_58,fVar3,6,9);
      local_58.y = local_4c + a->y;
      local_58.x = b->x - local_4c;
      PathArcToFast(this,&local_58,local_4c,9,0xc);
      auVar9._8_8_ = 0;
      auVar9._0_4_ = b->x;
      auVar9._4_4_ = b->y;
      auVar7._4_4_ = local_48._0_4_;
      auVar7._0_4_ = local_48._0_4_;
      auVar7._8_4_ = local_48._0_4_;
      auVar7._12_4_ = local_48._0_4_;
      auVar6 = vsubps_avx(auVar9,auVar7);
      local_58 = (ImVec2)vmovlps_avx(auVar6);
      PathArcToFast(this,&local_58,(float)local_48._0_4_,0,3);
      local_58.y = b->y - local_50;
      local_58.x = local_50 + a->x;
      PathArcToFast(this,&local_58,local_50,3,6);
      return;
    }
  }
  this_00 = &this->_Path;
  ImVector<ImVec2>::push_back(this_00,a);
  local_58.y = a->y;
  local_58.x = b->x;
  ImVector<ImVec2>::push_back(this_00,&local_58);
  ImVector<ImVec2>::push_back(this_00,b);
  local_58.y = b->y;
  local_58.x = a->x;
  ImVector<ImVec2>::push_back(this_00,&local_58);
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, ImDrawCornerFlags rounding_corners)
{
    rounding = ImMin(rounding, ImFabs(b.x - a.x) * ( ((rounding_corners & ImDrawCornerFlags_Top)  == ImDrawCornerFlags_Top)  || ((rounding_corners & ImDrawCornerFlags_Bot)   == ImDrawCornerFlags_Bot)   ? 0.5f : 1.0f ) - 1.0f);
    rounding = ImMin(rounding, ImFabs(b.y - a.y) * ( ((rounding_corners & ImDrawCornerFlags_Left) == ImDrawCornerFlags_Left) || ((rounding_corners & ImDrawCornerFlags_Right) == ImDrawCornerFlags_Right) ? 0.5f : 1.0f ) - 1.0f);

    if (rounding <= 0.0f || rounding_corners == 0)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x, a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x, b.y));
    }
    else
    {
        const float rounding_tl = (rounding_corners & ImDrawCornerFlags_TopLeft) ? rounding : 0.0f;
        const float rounding_tr = (rounding_corners & ImDrawCornerFlags_TopRight) ? rounding : 0.0f;
        const float rounding_br = (rounding_corners & ImDrawCornerFlags_BotRight) ? rounding : 0.0f;
        const float rounding_bl = (rounding_corners & ImDrawCornerFlags_BotLeft) ? rounding : 0.0f;
        PathArcToFast(ImVec2(a.x + rounding_tl, a.y + rounding_tl), rounding_tl, 6, 9);
        PathArcToFast(ImVec2(b.x - rounding_tr, a.y + rounding_tr), rounding_tr, 9, 12);
        PathArcToFast(ImVec2(b.x - rounding_br, b.y - rounding_br), rounding_br, 0, 3);
        PathArcToFast(ImVec2(a.x + rounding_bl, b.y - rounding_bl), rounding_bl, 3, 6);
    }
}